

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O2

bool __thiscall QHstsCache::isKnownHost(QHstsCache *this,QUrl *url)

{
  _Base_ptr *this_00;
  char cVar1;
  bool bVar2;
  bool bVar3;
  iterator __position;
  qsizetype qVar4;
  long in_FS_OFFSET;
  key_type local_88;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    QUrl::host(&local_88,url,0x7f00000);
    bVar2 = is_valid_domain_name(&local_88.name);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (bVar2) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d._0_4_ = 0xaaaaaaaa;
      local_58.d._4_4_ = 0xaaaaaaaa;
      local_58.ptr._0_4_ = 0xaaaaaaaa;
      local_58.ptr._4_4_ = 0xaaaaaaaa;
      QUrl::host(&local_58,url,0x7f00000);
      local_88.fragment.m_data._4_4_ = local_58.ptr._4_4_;
      local_88.fragment.m_data._0_4_ = local_58.ptr._0_4_;
      local_88.fragment.m_size = local_58.size;
      local_88.name.d.size = 0;
      local_88.name.d.d = (Data *)0x0;
      local_88.name.d.ptr = (char16_t *)0x0;
      bVar3 = false;
      while (local_88.fragment.m_size != 0) {
        __position = std::
                     _Rb_tree<QHstsCache::HostName,_std::pair<const_QHstsCache::HostName,_QHstsPolicy>,_std::_Select1st<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                     ::find((_Rb_tree<QHstsCache::HostName,_std::pair<const_QHstsCache::HostName,_QHstsPolicy>,_std::_Select1st<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>,_std::less<QHstsCache::HostName>,_std::allocator<std::pair<const_QHstsCache::HostName,_QHstsPolicy>_>_>
                             *)this,&local_88);
        if ((_Rb_tree_header *)__position._M_node !=
            &(this->knownHosts)._M_t._M_impl.super__Rb_tree_header) {
          this_00 = &__position._M_node[2]._M_parent;
          bVar2 = QHstsPolicy::isExpired((QHstsPolicy *)this_00);
          if (bVar2) {
            std::
            _Rb_tree<QHstsCache::HostName,std::pair<QHstsCache::HostName_const,QHstsPolicy>,std::_Select1st<std::pair<QHstsCache::HostName_const,QHstsPolicy>>,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
            ::erase_abi_cxx11_((_Rb_tree<QHstsCache::HostName,std::pair<QHstsCache::HostName_const,QHstsPolicy>,std::_Select1st<std::pair<QHstsCache::HostName_const,QHstsPolicy>>,std::less<QHstsCache::HostName>,std::allocator<std::pair<QHstsCache::HostName_const,QHstsPolicy>>>
                                *)this,__position);
            if (this->hstsStore != (QHstsStore *)0x0) {
              QHstsStore::addToObserved(this->hstsStore,(QHstsPolicy *)this_00);
            }
          }
          else {
            bVar2 = true;
            if (!bVar3) goto LAB_0016cb86;
            bVar3 = QHstsPolicy::includesSubDomains((QHstsPolicy *)this_00);
            if (bVar3) goto LAB_0016cb86;
          }
        }
        bVar2 = false;
        qVar4 = QStringView::indexOf(&local_88.fragment,(QChar)0x2e,0,CaseSensitive);
        if (qVar4 == -1) goto LAB_0016cb86;
        local_88.fragment = QStringView::mid(&local_88.fragment,qVar4 + 1,-1);
        bVar3 = true;
      }
      bVar2 = false;
LAB_0016cb86:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      goto LAB_0016cb98;
    }
  }
  bVar2 = false;
LAB_0016cb98:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHstsCache::isKnownHost(const QUrl &url) const
{
    if (!url.isValid() || !is_valid_domain_name(url.host()))
        return false;

    /*
        RFC6797, 8.2.  Known HSTS Host Domain Name Matching

        * Superdomain Match
          If a label-for-label match between an entire Known HSTS Host's
          domain name and a right-hand portion of the given domain name
          is found, then this Known HSTS Host's domain name is a
          superdomain match for the given domain name.  There could be
          multiple superdomain matches for a given domain name.
        * Congruent Match
          If a label-for-label match between a Known HSTS Host's domain
          name and the given domain name is found -- i.e., there are no
          further labels to compare -- then the given domain name
          congruently matches this Known HSTS Host.

        We start from the congruent match, and then chop labels and dots and
        proceed with superdomain match. While RFC6797 recommends to start from
        superdomain, the result is the same - some valid policy will make a host
        known.
    */

    bool superDomainMatch = false;
    const QString hostNameAsString(url.host());
    HostName nameToTest(QStringView{hostNameAsString});
    while (nameToTest.fragment.size()) {
        auto const pos = knownHosts.find(nameToTest);
        if (pos != knownHosts.end()) {
            if (pos->second.isExpired()) {
                knownHosts.erase(pos);
#if QT_CONFIG(settings)
                if (hstsStore) {
                    // Inform our store that this policy has expired.
                    hstsStore->addToObserved(pos->second);
                }
#endif // QT_CONFIG(settings)
            } else if (!superDomainMatch || pos->second.includesSubDomains()) {
                return true;
            }
        }

        const qsizetype dot = nameToTest.fragment.indexOf(u'.');
        if (dot == -1)
            break;

        nameToTest.fragment = nameToTest.fragment.mid(dot + 1);
        superDomainMatch = true;
    }

    return false;
}